

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O1

bool llvm::is_contained<llvm::SmallPtrSet<llvm::cl::SubCommand*,4u>&,llvm::cl::SubCommand*>
               (SmallPtrSet<llvm::cl::SubCommand_*,_4U> *Range,SubCommand **Element)

{
  uint *puVar1;
  void **ppvVar2;
  void **ppvVar3;
  uint *puVar4;
  uint *puVar5;
  SmallPtrSetIteratorImpl local_48;
  void **local_38;
  
  local_48.Bucket =
       (Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).super_SmallPtrSetImplBase.CurArray;
  puVar1 = &(Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).super_SmallPtrSetImplBase.
            NumNonEmpty;
  puVar5 = &(Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).super_SmallPtrSetImplBase.
            CurArraySize;
  puVar4 = puVar5;
  if (local_48.Bucket ==
      (Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).super_SmallPtrSetImplBase.SmallArray) {
    puVar4 = puVar1;
  }
  local_48.End = local_48.Bucket + *puVar4;
  SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_48);
  ppvVar2 = local_48.Bucket;
  local_38 = local_48.End;
  local_48.Bucket =
       (Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).super_SmallPtrSetImplBase.CurArray;
  if (local_48.Bucket ==
      (Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).super_SmallPtrSetImplBase.SmallArray) {
    puVar5 = puVar1;
  }
  local_48.Bucket = local_48.Bucket + *puVar5;
  local_48.End = local_48.Bucket;
  SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_48);
  ppvVar3 = local_48.Bucket;
  local_48.End = local_38;
  while (ppvVar2 != ppvVar3) {
    if (local_48.End <= ppvVar2) {
      local_48.Bucket = ppvVar2;
      __assert_fail("Bucket < End",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                    ,0x122,
                    "const PtrTy llvm::SmallPtrSetIterator<llvm::cl::SubCommand *>::operator*() const [PtrTy = llvm::cl::SubCommand *]"
                   );
    }
    if ((SubCommand *)*ppvVar2 == *Element) break;
    local_48.Bucket = ppvVar2 + 1;
    SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_48);
    ppvVar2 = local_48.Bucket;
  }
  local_48.Bucket =
       (Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).super_SmallPtrSetImplBase.CurArray;
  local_48.Bucket =
       local_48.Bucket +
       *(uint *)((long)Range->SmallStorage +
                (ulong)(local_48.Bucket ==
                       (Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).
                       super_SmallPtrSetImplBase.SmallArray) * 4 + -0x10);
  local_48.End = local_48.Bucket;
  SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_48);
  return ppvVar2 != local_48.Bucket;
}

Assistant:

bool is_contained(R &&Range, const E &Element) {
  return std::find(adl_begin(Range), adl_end(Range), Element) != adl_end(Range);
}